

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O0

SearchResult __thiscall
anon_unknown.dwarf_16c67c::CliqueRunner::expand<true>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<true,_const_SVOBitset_&,_int> a,int spacepos)

{
  bool bVar1;
  uint uVar2;
  pointer c_00;
  long lVar3;
  size_type sVar4;
  uint *puVar5;
  CliqueRunner *this_00;
  pointer pRVar6;
  _List_node_base *in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  _List_node_base *in_R8;
  pointer in_R9;
  SVOBitset *unaff_retaddr;
  conditional_t<true,_const_SVOBitset_&,_int> in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_00000078;
  Proof *in_stack_00000080;
  int m;
  SVOBitset new_a;
  SVOBitset new_p;
  int v_2;
  vector<int,_std::allocator<int>_> c_unpermuted;
  int v;
  int v_1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  colour_classes;
  int n;
  int p_end;
  int *p_bounds;
  int *p_order;
  SVOBitset *in_stack_fffffffffffffd38;
  SVOBitset *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  SVOBitset *in_stack_fffffffffffffd50;
  ulong in_stack_fffffffffffffd58;
  SearchResult in_stack_fffffffffffffd60;
  undefined2 in_stack_fffffffffffffd64;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd68;
  Proof *in_stack_fffffffffffffd70;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd78;
  CliqueRunner *in_stack_fffffffffffffd80;
  CliqueRunner *in_stack_fffffffffffffd88;
  Proof *in_stack_fffffffffffffd90;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  CliqueRunner *in_stack_fffffffffffffdc8;
  anon_class_8_1_54a39803 *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  int iVar7;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  int *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  element_type *in_stack_ffffffffffffff28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  SVOBitset *in_stack_ffffffffffffff40;
  SVOBitset *in_stack_ffffffffffffff48;
  CliqueRunner *in_stack_ffffffffffffff50;
  int local_9c;
  int local_6c;
  int local_50;
  undefined4 in_stack_ffffffffffffffe8;
  SearchResult local_4;
  
  *in_RDX = *in_RDX + 1;
  in_R8->_M_next = (_List_node_base *)((long)&in_R8->_M_next->_M_next + 1);
  c_00 = (pointer)(in_RDI[0x291] + (long)in_stack_00000018 * 4);
  lVar3 = in_RDI[0x291] + (long)(in_stack_00000018 + (int)in_RDI[7]) * 4;
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
  if (bVar1) {
    colour_class_order((CliqueRunner *)in_stack_fffffffffffffe90,
                       (SVOBitset *)in_stack_fffffffffffffe88,(int *)in_stack_fffffffffffffe80,
                       (int *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  }
  else {
    connected_colour_class_order
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30._M_pi,
               (int *)in_stack_ffffffffffffff28);
  }
  local_50 = -1;
  do {
    if (local_50 < 0) {
LAB_001a2ec1:
      pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
               operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                           *)0x1a2ed5);
      (*pRVar6->_vptr_RestartsSchedule[2])();
      pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
               operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                           *)0x1a2ef2);
      uVar2 = (*pRVar6->_vptr_RestartsSchedule[4])();
      if ((uVar2 & 1) == 0) {
        local_4 = Complete;
      }
      else {
        post_nogood(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        local_4 = Restart;
      }
      return local_4;
    }
    std::__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a2391);
    bVar1 = gss::Timeout::should_abort((Timeout *)0x1a2399);
    if (bVar1) {
      return Aborted;
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)in_R9)
    ;
    if (sVar4 + (long)*(int *)(lVar3 + (long)local_50 * 4) <= (ulong)*(uint *)(in_RDI + 1)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (bVar1) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)0x1a240e);
        for (local_6c = 0; local_6c <= local_50; local_6c = local_6c + 1) {
          if ((local_6c == 0) ||
             (*(int *)(lVar3 + (long)(local_6c + -1) * 4) != *(int *)(lVar3 + (long)local_6c * 4)))
          {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::emplace_back<>((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)in_stack_fffffffffffffd40);
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_fffffffffffffd40);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),
                     (long)*(int *)((long)&((_Vector_impl_data *)
                                           &(c_00->
                                            super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                                            )._M_impl._M_node)->_M_start + (long)local_6c * 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        }
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a250b);
        gss::innards::Proof::colour_bound(in_stack_00000080,in_stack_00000078);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)in_stack_fffffffffffffd50);
      }
      goto LAB_001a2ec1;
    }
    iVar7 = *(int *)((long)&((_Vector_impl_data *)
                            &(c_00->
                             super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                             )._M_impl._M_node)->_M_start + (long)local_50 * 4);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
    if ((!bVar1) &&
       (bVar1 = gss::innards::SVOBitset::test
                          ((SVOBitset *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,
                                             CONCAT24(in_stack_fffffffffffffd64,
                                                      in_stack_fffffffffffffd60))),
                           (int)(in_stack_fffffffffffffd58 >> 0x20)), !bVar1)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (bVar1) {
        unpermute(in_stack_fffffffffffffd88,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
        for (local_9c = 0; iVar7 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),
            local_9c <= local_50; local_9c = local_9c + 1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1a25e1);
          unpermute(in_stack_fffffffffffffd88,
                    (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),
                     (long)*(int *)((long)&((_Vector_impl_data *)
                                           &(c_00->
                                            super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                                            )._M_impl._M_node)->_M_start + (long)local_9c * 4));
          gss::innards::Proof::not_connected_in_underlying_graph
                    (in_stack_fffffffffffffd90,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd88,
                     (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
        }
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a26b3);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a26d5);
        unpermute(in_stack_fffffffffffffd88,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
        gss::innards::Proof::backtrack_from_binary_variables
                  ((Proof *)in_stack_fffffffffffffdf0,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a272b);
        gss::innards::Proof::forget_level((Proof *)in_stack_fffffffffffffd40,iVar7);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
      }
      goto LAB_001a2ec1;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
              );
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1a27ae);
    if ((bVar1) ||
       (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1a27c6), bVar1)) {
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1a27e3);
      if (((bVar1) &&
          (uVar2 = *(uint *)(in_RDI + 1),
          puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1a2804),
          *puVar5 <= uVar2)) ||
         ((bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1a2823), bVar1
          && (uVar2 = *(uint *)(in_RDI + 1),
             puVar5 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1a2847),
             *puVar5 <= uVar2)))) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
        if (bVar1) {
          this_00 = (CliqueRunner *)
                    std::
                    __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1a287e);
          unpermute(this_00,(vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
          gss::innards::Proof::post_solution(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
        }
        return DecidedTrue;
      }
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (((bVar1) &&
          (sVar4 = std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)in_R9),
          *(uint *)(in_RDI + 1) < sVar4)) && ((*(byte *)(*in_RDI + 0xc0) & 1) == 0)) {
        in_stack_fffffffffffffd70 = (Proof *)(in_RDI + 5);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a2969);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        in_stack_fffffffffffffd78 =
             (vector<int,_std::allocator<int>_> *)
             std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a297d);
        in_stack_fffffffffffffd80 = (CliqueRunner *)&stack0xffffffffffffff00;
        unpermute_and_finish(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        gss::innards::Proof::new_incumbent
                  ((Proof *)in_stack_fffffffffffffde0,
                   (vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::~vector
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                   in_stack_fffffffffffffd50);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a29d3);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
      }
      Incumbent::update((Incumbent *)in_stack_fffffffffffffd50,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (unsigned_long_long *)in_stack_fffffffffffffd40,
                        (unsigned_long_long *)in_stack_fffffffffffffd38);
    }
    in_stack_fffffffffffffd68 = (vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe78;
    gss::innards::SVOBitset::SVOBitset(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
               (in_RDI + 8),(long)iVar7);
    gss::innards::SVOBitset::operator&=
              (in_stack_fffffffffffffd50,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    pRVar6 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                         *)0x1a2a8c);
    uVar2 = (*pRVar6->_vptr_RestartsSchedule[5])();
    in_stack_fffffffffffffd67 = (undefined1)uVar2;
    if ((uVar2 & 1) != 0) {
      gss::innards::Watches<int,(anonymous_namespace)::FlatWatchTable>::
      propagate<(anonymous_namespace)::CliqueRunner::expand<true>(int,unsigned_long_long&,unsigned_long_long&,unsigned_long_long&,std::vector<int,std::allocator<int>>&,gss::innards::SVOBitset&,std::conditional<true,gss::innards::SVOBitset_const&,int>::type,int)::_lambda(int)_1_,(anonymous_namespace)::CliqueRunner::expand<true>(int,unsigned_long_long&,unsigned_long_long&,unsigned_long_long&,std::vector<int,std::allocator<int>>&,gss::innards::SVOBitset&,std::conditional<true,gss::innards::SVOBitset_const&,int>::type,int)::_lambda(int)_2_>
                ((Watches<int,_(anonymous_namespace)::FlatWatchTable> *)in_stack_fffffffffffffde0,
                 in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0,
                 (anon_class_8_1_a857bcb1 *)in_stack_fffffffffffffdc8);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
    if (bVar1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a2b38);
      gss::innards::Proof::start_level((Proof *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c)
      ;
    }
    in_stack_fffffffffffffd66 =
         gss::innards::SVOBitset::any
                   ((SVOBitset *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    if ((bool)in_stack_fffffffffffffd66) {
      gss::innards::SVOBitset::SVOBitset(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                ((vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *)
                 (in_RDI + 0xb),(long)iVar7);
      gss::innards::SVOBitset::operator|=
                (in_stack_fffffffffffffd50,
                 (SVOBitset *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      in_stack_fffffffffffffd48 = in_stack_00000018 + (int)in_RDI[7] * 2;
      in_stack_fffffffffffffd40 = (SVOBitset *)&stack0xfffffffffffffde0;
      in_stack_fffffffffffffd38 = (SVOBitset *)&stack0xfffffffffffffe78;
      in_stack_fffffffffffffd60 =
           expand<true>((CliqueRunner *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                        (int)((ulong)in_RDX >> 0x20),(unsigned_long_long *)in_RCX,
                        (unsigned_long_long *)in_R8,(unsigned_long_long *)in_R9,
                        (vector<int,_std::allocator<int>_> *)c_00,unaff_retaddr,in_stack_00000008,
                        in_stack_00000010);
      in_stack_fffffffffffffd58 = (ulong)in_stack_fffffffffffffd60;
      switch(in_stack_fffffffffffffd58) {
      case 0:
        local_4 = Aborted;
        iVar7 = 1;
        break;
      case 1:
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x1a2cb6);
        for (in_stack_fffffffffffffdd8 = -1; local_50 < in_stack_fffffffffffffdd8;
            in_stack_fffffffffffffdd8 = in_stack_fffffffffffffdd8 + -1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          post_nogood(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)0x1a2d1e);
        }
        local_4 = Restart;
        iVar7 = 1;
        break;
      case 2:
      default:
        iVar7 = 0;
        break;
      case 3:
        local_4 = DecidedTrue;
        iVar7 = 1;
      }
      gss::innards::SVOBitset::~SVOBitset(in_stack_fffffffffffffd40);
      if (iVar7 == 0) goto LAB_001a2d74;
    }
    else {
LAB_001a2d74:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 5));
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a2d9f);
        gss::innards::Proof::start_level
                  ((Proof *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c);
        in_stack_fffffffffffffd50 =
             (SVOBitset *)
             std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a2dc1);
        unpermute(in_stack_fffffffffffffd88,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd80);
        gss::innards::Proof::backtrack_from_binary_variables
                  ((Proof *)in_stack_fffffffffffffdf0,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50);
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a2e17);
        gss::innards::Proof::forget_level
                  ((Proof *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      }
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1a2e5c);
      gss::innards::SVOBitset::reset
                ((SVOBitset *)
                 CONCAT17(in_stack_fffffffffffffd67,
                          CONCAT16(in_stack_fffffffffffffd66,
                                   CONCAT24(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60))),
                 (int)(in_stack_fffffffffffffd58 >> 0x20));
      iVar7 = 0;
    }
    gss::innards::SVOBitset::~SVOBitset(in_stack_fffffffffffffd40);
    if (iVar7 != 0) {
      return local_4;
    }
    local_50 = local_50 + -1;
    in_stack_fffffffffffffddc = 0;
  } while( true );
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }